

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_188870::generateRandomHeaders
               (int partCount,vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *headers)

{
  char *pcVar1;
  int in_EDI;
  LevelMode lm;
  int levelMode;
  int tileY;
  int tileX;
  stringstream ss;
  int partType;
  int pixelType;
  Header header;
  int i;
  int in_stack_fffffffffffffd54;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  int in_stack_fffffffffffffd60;
  int iVar2;
  TileDescription local_268;
  LevelMode local_258;
  int local_254;
  uint local_250;
  uint local_24c;
  Channel local_248 [16];
  Channel local_238 [16];
  Channel local_228 [16];
  string local_218 [32];
  stringstream local_1f8 [16];
  undefined1 local_1e8 [376];
  int local_70;
  int local_5c;
  Vec2<float> local_58;
  TileDescription local_50 [3];
  int local_14;
  int local_4;
  
  local_4 = in_EDI;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::clear
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x1c5d53);
  for (local_14 = 0; local_14 < local_4; local_14 = local_14 + 1) {
    Imath_3_2::Vec2<float>::Vec2(&local_58,0.0,0.0);
    Imf_3_4::Header::Header
              ((Header *)local_50,0xc5,0x107,1.0,(Vec2 *)&local_58,1.0,INCREASING_Y,ZIP_COMPRESSION)
    ;
    local_5c = random_int(in_stack_fffffffffffffd54);
    local_70 = random_int(in_stack_fffffffffffffd54);
    std::__cxx11::stringstream::stringstream(local_1f8);
    std::ostream::operator<<(local_1e8,local_14);
    std::__cxx11::stringstream::str();
    Imf_3_4::Header::setName((string *)local_50);
    std::__cxx11::string::~string(local_218);
    if (local_5c == 0) {
      pcVar1 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_228,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar1,(Channel *)"UINT");
    }
    else if (local_5c == 1) {
      pcVar1 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_238,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar1,(Channel *)"FLOAT");
    }
    else if (local_5c == 2) {
      pcVar1 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_248,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar1,(Channel *)"HALF");
    }
    iVar2 = local_70;
    if (local_70 == 0) {
      Imf_3_4::Header::setType((string *)local_50);
    }
    else if (local_70 == 1) {
      Imf_3_4::Header::setType((string *)local_50);
    }
    if (local_70 == 1) {
      in_stack_fffffffffffffd60 = random_int(in_stack_fffffffffffffd54);
      local_24c = in_stack_fffffffffffffd60 + 1;
      in_stack_fffffffffffffd5c = random_int(in_stack_fffffffffffffd54);
      local_250 = in_stack_fffffffffffffd5c + 1;
      in_stack_fffffffffffffd54 = random_int(in_stack_fffffffffffffd54);
      local_258 = NUM_LEVELMODES;
      if (in_stack_fffffffffffffd54 == 0) {
        local_258 = ONE_LEVEL;
      }
      else if (in_stack_fffffffffffffd54 == 1) {
        local_258 = MIPMAP_LEVELS;
      }
      else if (in_stack_fffffffffffffd54 == 2) {
        local_258 = RIPMAP_LEVELS;
      }
      in_stack_fffffffffffffd58 = in_stack_fffffffffffffd54;
      local_254 = in_stack_fffffffffffffd54;
      Imf_3_4::TileDescription::TileDescription(&local_268,local_24c,local_250,local_258,ROUND_DOWN)
      ;
      Imf_3_4::Header::setTileDescription(local_50);
    }
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               CONCAT44(iVar2,in_stack_fffffffffffffd60),
               (value_type *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::__cxx11::stringstream::~stringstream(local_1f8);
    Imf_3_4::Header::~Header((Header *)local_50);
  }
  return;
}

Assistant:

void
generateRandomHeaders (int partCount, vector<Header>& headers)
{
    headers.clear ();

    for (int i = 0; i < partCount; i++)
    {
        Header header (width, height);
        int    pixelType = random_int (3);
        int    partType  = random_int (2);

        stringstream ss;
        ss << i;
        header.setName (ss.str ());

        switch (pixelType)
        {
            case 0:
                header.channels ().insert ("UINT", Channel (IMF::UINT));
                break;
            case 1:
                header.channels ().insert ("FLOAT", Channel (IMF::FLOAT));
                break;
            case 2:
                header.channels ().insert ("HALF", Channel (IMF::HALF));
                break;
        }

        switch (partType)
        {
            case 0: header.setType (IMF::SCANLINEIMAGE); break;
            case 1: header.setType (IMF::TILEDIMAGE); break;
        }

        int tileX;
        int tileY;
        int levelMode;
        if (partType == 1)
        {
            tileX        = random_int (width) + 1;
            tileY        = random_int (height) + 1;
            levelMode    = random_int (3);
            LevelMode lm = NUM_LEVELMODES;
            switch (levelMode)
            {
                case 0: lm = ONE_LEVEL; break;
                case 1: lm = MIPMAP_LEVELS; break;
                case 2: lm = RIPMAP_LEVELS; break;
            }
            header.setTileDescription (TileDescription (tileX, tileY, lm));
        }

        headers.push_back (header);
    }
}